

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_minimize_assumptions(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int nLits_00;
  ulong uVar7;
  ulong uVar8;
  uint local_44;
  
  if (nLits == 1) {
LAB_0055998e:
    if (nConfLimit != 0) {
      s->nConfLimit = (long)nConfLimit + (s->stats).conflicts;
    }
    iVar2 = sat_solver_solve_internal(s);
    return (uint)(iVar2 != -1);
  }
  uVar7 = (ulong)(uint)nLits;
LAB_005599cb:
  iVar2 = (int)uVar7;
  if (iVar2 < 2) {
    __assert_fail("nLits >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x8ab,"int sat_solver_minimize_assumptions(sat_solver *, int *, int, int)");
  }
  uVar7 = uVar7 >> 1;
  nLits_00 = (int)uVar7;
  iVar2 = iVar2 - nLits_00;
  iVar5 = 1;
  uVar8 = 0;
  do {
    iVar3 = sat_solver_push(s,pLits[uVar8]);
    if (iVar3 == 0) goto LAB_00559bbc;
    uVar8 = uVar8 + 1;
    iVar5 = iVar5 + 1;
  } while (uVar7 != uVar8);
  if (nConfLimit != 0) {
    s->nConfLimit = (s->stats).conflicts + (long)nConfLimit;
  }
  iVar5 = sat_solver_solve_internal(s);
  uVar8 = uVar7;
  if (iVar5 != -1) {
    local_44 = 1;
    if (iVar2 != 1) {
      local_44 = sat_solver_minimize_assumptions(s,pLits + uVar7,iVar2,nConfLimit);
    }
    do {
      sat_solver_pop(s);
      uVar6 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar6;
    } while (uVar6 != 0);
    if ((s->temp_clause).size < 0) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->temp_clause).size = 0;
    piVar4 = (s->temp_clause).ptr;
    uVar8 = 0;
    do {
      iVar2 = pLits[uVar8];
      uVar6 = (s->temp_clause).size;
      if (uVar6 == (s->temp_clause).cap) {
        iVar5 = (uVar6 >> 1) * 3;
        if ((int)uVar6 < 4) {
          iVar5 = uVar6 * 2;
        }
        if (piVar4 == (int *)0x0) {
          piVar4 = (int *)malloc((long)iVar5 << 2);
        }
        else {
          piVar4 = (int *)realloc(piVar4,(long)iVar5 << 2);
        }
        (s->temp_clause).ptr = piVar4;
        if (piVar4 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar5 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_clause).cap = iVar5;
        uVar6 = (s->temp_clause).size;
      }
      (s->temp_clause).size = uVar6 + 1;
      piVar4[(int)uVar6] = iVar2;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    if (0 < (int)local_44) {
      uVar8 = 0;
      do {
        pLits[uVar8] = pLits[uVar7 + uVar8];
        uVar8 = uVar8 + 1;
      } while (local_44 != uVar8);
    }
    piVar4 = (s->temp_clause).ptr;
    uVar8 = 0;
    do {
      (pLits + (int)local_44)[uVar8] = piVar4[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    if ((int)local_44 < 1) {
LAB_00559c00:
      if (nConfLimit != 0) {
        s->nConfLimit = (long)nConfLimit + (s->stats).conflicts;
      }
      iVar2 = sat_solver_solve_internal(s);
      if (iVar2 != -1) {
        iVar2 = 1;
        if (nLits_00 != 1) {
          iVar2 = sat_solver_minimize_assumptions(s,pLits + (int)local_44,nLits_00,nConfLimit);
        }
        uVar6 = local_44;
        if (0 < (int)local_44) {
          do {
            sat_solver_pop(s);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        return local_44 + iVar2;
      }
      uVar6 = local_44;
      if ((int)local_44 < 1) {
        return local_44;
      }
      do {
        sat_solver_pop(s);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      return local_44;
    }
    iVar2 = 1;
    uVar8 = 0;
    while (iVar5 = sat_solver_push(s,pLits[uVar8]), iVar5 != 0) {
      uVar8 = uVar8 + 1;
      iVar2 = iVar2 + 1;
      if (local_44 == uVar8) goto LAB_00559c00;
    }
    do {
      sat_solver_pop(s);
      iVar5 = iVar2 + -1;
      bVar1 = 0 < iVar2;
      iVar2 = iVar5;
    } while (iVar5 != 0 && bVar1);
    goto LAB_00559bd7;
  }
  do {
    sat_solver_pop(s);
    uVar6 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar6;
  } while (uVar6 != 0);
  goto LAB_00559bee;
LAB_00559bbc:
  do {
    sat_solver_pop(s);
    iVar2 = iVar5 + -1;
    bVar1 = 0 < iVar5;
    iVar5 = iVar2;
  } while (iVar2 != 0 && bVar1);
LAB_00559bd7:
  uVar7 = (ulong)((int)uVar8 + 1);
LAB_00559bee:
  if ((int)uVar7 == 1) goto LAB_0055998e;
  goto LAB_005599cb;
}

Assistant:

int sat_solver_minimize_assumptions( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR, status;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
        status = sat_solver_solve_internal( s );
        //printf( "%c", status == l_False ? 'u' : 's' );
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nLitsL; i++ )
            sat_solver_pop(s);
        return sat_solver_minimize_assumptions( s, pLits, nLitsL, nConfLimit );
    }
    // solve for the right lits
    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nResL; i++ )
            sat_solver_pop(s);
        return nResL;
    }
    // solve for the left lits
    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}